

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_cross_entropy_loss_back(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,ggml_tensor *c)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  char *pcVar3;
  int line;
  
  _Var1 = ggml_is_scalar(a);
  if (_Var1) {
    _Var1 = ggml_are_same_shape(b,c);
    if (_Var1) {
      pgVar2 = ggml_dup_tensor(ctx,b);
      pgVar2->op = GGML_OP_CROSS_ENTROPY_LOSS_BACK;
      pgVar2->src[0] = a;
      pgVar2->src[1] = b;
      pgVar2->src[2] = c;
      return pgVar2;
    }
    pcVar3 = "ggml_are_same_shape(b, c)";
    line = 0x13fe;
  }
  else {
    pcVar3 = "ggml_is_scalar(a)";
    line = 0x13fd;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar3);
}

Assistant:

struct ggml_tensor * ggml_cross_entropy_loss_back(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        struct ggml_tensor  * c) {
    GGML_ASSERT(ggml_is_scalar(a));
    GGML_ASSERT(ggml_are_same_shape(b, c));

    struct ggml_tensor * result = ggml_dup_tensor(ctx, b);

    result->op     = GGML_OP_CROSS_ENTROPY_LOSS_BACK;
    result->src[0] = a;
    result->src[1] = b;
    result->src[2] = c;

    return result;
}